

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void testing::internal::TuplePrefix<3ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<char_const*>,testing::Matcher<char**>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>,std::tr1::tuple<char_const*,char**,__locale_struct*,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<const_char_*>,_testing::Matcher<char_**>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<const_char_*,_char_**,___locale_struct_*,_void,_void,_void,_void,_void,_void,_void>
               *values,ostream *os)

{
  __locale_struct *p_Var1;
  MatcherInterface<__locale_struct_*> *pMVar2;
  linked_ptr_internal lVar3;
  int iVar4;
  ostream *poVar5;
  type matcher;
  StringMatchResultListener listener;
  linked_ptr<const_testing::MatcherInterface<__locale_struct_*>_> local_1f8;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  TuplePrefix<2ul>::
  ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<char_const*>,testing::Matcher<char**>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>,std::tr1::tuple<char_const*,char**,__locale_struct*,void,void,void,void,void,void,void>>
            (matchers,values,os);
  local_1f8.value_ = (matchers->f2_).super_MatcherBase<__locale_struct_*>.impl_.value_;
  lVar3.next_ = &local_1f8.link_;
  if (local_1f8.value_ != (MatcherInterface<__locale_struct_*> *)0x0) {
    linked_ptr_internal::join
              (&local_1f8.link_,&(matchers->f2_).super_MatcherBase<__locale_struct_*>.impl_.link_);
    lVar3.next_ = local_1f8.link_.next_;
  }
  local_1f8.link_.next_ = lVar3.next_;
  p_Var1 = values->f2_;
  local_1c0 = local_1a8;
  local_1c8 = &PTR__StringMatchResultListener_00186798;
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar4 = (*((local_1f8.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4]
          )(local_1f8.value_,p_Var1,&local_1c8);
  if ((char)iVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pMVar2 = (matchers->f2_).super_MatcherBase<__locale_struct_*>.impl_.value_;
    (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar2,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    DefaultPrintTo<__locale_struct>(0,p_Var1,os);
    std::__cxx11::stringbuf::str();
    iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_00186798;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  linked_ptr<const_testing::MatcherInterface<__locale_struct_*>_>::~linked_ptr(&local_1f8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }